

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEException.cpp
# Opt level: O0

bool __thiscall test_CEException::test_sofa_error(test_CEException *this)

{
  undefined8 uVar1;
  int *in_RDI;
  string *unaff_retaddr;
  string *in_stack_00000008;
  sofa_error *in_stack_00000010;
  sofa_error *e;
  allocator local_89;
  string local_88 [32];
  undefined4 local_68;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [24];
  string *in_stack_fffffffffffffff0;
  
  uVar1 = __cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"test_CEException::test_sofa_error()",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"No method currently checked",&local_61);
  local_68 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Testing throwing \'CEException::sofa_error",&local_89);
  CEException::sofa_error::sofa_error
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
  __cxa_throw(uVar1,&CEException::sofa_error::typeinfo,CEException::sofa_error::~sofa_error);
}

Assistant:

bool test_CEException::test_sofa_error(void)
{
    // Try throwing
    try {
        // TODO: find a sofa method that can be configured to return a bad error code
        throw CEException::sofa_error("test_CEException::test_sofa_error()",
                                      "No method currently checked",
                                      1, "Testing throwing 'CEException::sofa_error");
        // If we get here there's a problem
        log_failure("CEException::sofa_error failed to throw", __func__, __LINE__);
        update_pass(false);
    } catch (CEException::sofa_error & e) {
        // This is where we should be
        log_success("CEException::sofa_error thrown successfully", __func__, __LINE__);
        update_pass(true);
    }

    return pass();
}